

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

double __thiscall pstore::logger::log(logger *this,double __x)

{
  long *plVar1;
  long *plVar2;
  char *in_RDX;
  uint in_ESI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 uVar4;
  allocator local_a9;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88;
  ulong local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  long *local_48;
  ulong local_40;
  long local_38 [2];
  
  std::__cxx11::string::string((string *)&local_48,in_RDX,&local_a9);
  plVar1 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_48,local_40,0,'\x01');
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_98 = *plVar2;
    lStack_90 = plVar1[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar2;
    local_a8 = (long *)*plVar1;
  }
  local_a0 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_a8);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_78 = *plVar2;
    lStack_70 = plVar1[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar2;
    local_88 = (long *)*plVar1;
  }
  local_80 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_88,local_80,0,'\x01');
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_58 = *plVar2;
    uStack_50 = (undefined4)plVar1[3];
    uStack_4c = *(undefined4 *)((long)plVar1 + 0x1c);
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar2;
    local_68 = (long *)*plVar1;
  }
  local_60 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  (*this->_vptr_logger[2])(this,(ulong)in_ESI);
  uVar3 = extraout_XMM0_Da;
  uVar4 = extraout_XMM0_Db;
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
    uVar3 = extraout_XMM0_Da_00;
    uVar4 = extraout_XMM0_Db_00;
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
    uVar3 = extraout_XMM0_Da_01;
    uVar4 = extraout_XMM0_Db_01;
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
    uVar3 = extraout_XMM0_Da_02;
    uVar4 = extraout_XMM0_Db_02;
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
    uVar3 = extraout_XMM0_Da_03;
    uVar4 = extraout_XMM0_Db_03;
  }
  return (double)CONCAT44(uVar4,uVar3);
}

Assistant:

void logger::log (priority const p, gsl::czstring const part1, quoted const part2) {
            this->log (p, std::string{part1} + '"' + static_cast<gsl::czstring> (part2) + '"');
        }